

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  SerialArena *this_00;
  CleanupNode *pCVar2;
  CleanupNode *pCVar3;
  long lVar4;
  char *pcVar5;
  string *psVar6;
  __pointer_type pAVar7;
  void *pvVar8;
  CleanupNode *pCVar9;
  __pointer_type pAVar10;
  CleanupNode *pCVar11;
  undefined8 uVar12;
  ulong n_00;
  size_type sStack_50;
  __base_type local_40 [2];
  
  lVar4 = __tls_get_addr(&PTR_001b1f10);
  if (*(uint64_t *)(lVar4 + 8) != this->tag_and_id_) {
    pvVar8 = AllocateAlignedWithCleanupFallback(this,n,align,destructor);
    return pvVar8;
  }
  this_00 = *(SerialArena **)(lVar4 + 0x10);
  n_00 = n + 7 & 0xfffffffffffffff8;
  local_40[0]._M_p = (__pointer_type)ArenaAlignAs(align);
  pcVar5 = ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)local_40,(this_00->ptr_)._M_b._M_p);
  pAVar1 = (__pointer_type)(pcVar5 + n_00);
  if ((__pointer_type)this_00->limit_ < pAVar1) {
    pvVar8 = SerialArena::AllocateAlignedWithCleanupFallback(this_00,n_00,align,destructor);
    return pvVar8;
  }
  (this_00->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar2 = (this_00->cleanup_list_).next_;
  if (pCVar2 < (this_00->cleanup_list_).limit_) {
    (this_00->cleanup_list_).next_ = pCVar2 + 1;
    pCVar2->elem = pcVar5;
    pCVar2->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this_00->cleanup_list_,pcVar5,destructor,this_00);
  }
  pCVar2 = (CleanupNode *)(this_00->cleanup_list_).prefetch_ptr_;
  if ((pCVar2 != (CleanupNode *)0x0) && (pCVar2 < (CleanupNode *)(this_00->cleanup_list_).head_)) {
    pcVar5 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    sStack_50 = 0x90;
    uVar12 = 0x137;
    goto LAB_00129b8d;
  }
  pCVar3 = (this_00->cleanup_list_).next_;
  pCVar9 = pCVar2;
  if (((long)pCVar2 - (long)pCVar3 < 0x181) &&
     (pCVar11 = (this_00->cleanup_list_).limit_, pCVar2 < pCVar11)) {
    pCVar9 = pCVar3;
    if (pCVar3 < pCVar2) {
      pCVar9 = pCVar2;
    }
    if (pCVar9 != (CleanupNode *)0x0) {
      if (pCVar9 + 0x18 < pCVar11) {
        pCVar11 = pCVar9 + 0x18;
      }
      for (; pCVar9 < pCVar11; pCVar9 = pCVar9 + 4) {
      }
      goto LAB_00129a16;
    }
  }
  else {
LAB_00129a16:
    (this_00->cleanup_list_).prefetch_ptr_ = (char *)pCVar9;
    local_40[0]._M_p = (this_00->ptr_)._M_b._M_p;
    psVar6 = absl::lts_20240722::log_internal::Check_GEImpl<char*,char*>
                       (&this_00->limit_,&local_40[0]._M_p,"limit_ >= ptr()");
    if (psVar6 != (string *)0x0) {
      pcVar5 = (psVar6->_M_dataplus)._M_p;
      sStack_50 = psVar6->_M_string_length;
      uVar12 = 0xf3;
      goto LAB_00129b8d;
    }
    pAVar7 = (__pointer_type)this_00->prefetch_ptr_;
    if ((pAVar7 != (__pointer_type)0x0) && (pAVar7 < (this_00->head_)._M_b._M_p)) {
      pcVar5 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      sStack_50 = 0x67;
      uVar12 = 0x12e;
      goto LAB_00129b8d;
    }
    if ((0x400 < (long)pAVar7 - (long)pAVar1) ||
       (pAVar10 = (__pointer_type)this_00->limit_, pAVar10 <= pAVar7)) {
LAB_00129a6a:
      this_00->prefetch_ptr_ = (char *)pAVar7;
      return pcVar5;
    }
    if (pAVar1 < pAVar7) {
      pAVar1 = pAVar7;
    }
    pAVar7 = pAVar1;
    if (pAVar7 != (__pointer_type)0x0) {
      if (pAVar7 + 0x40 < pAVar10) {
        pAVar10 = pAVar7 + 0x40;
      }
      for (; pAVar7 < pAVar10; pAVar7 = pAVar7 + 4) {
      }
      goto LAB_00129a6a;
    }
  }
  pcVar5 = "prefetch_ptr != nullptr";
  sStack_50 = 0x17;
  uVar12 = 0x123;
LAB_00129b8d:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,uVar12,sStack_50,pcVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_40);
}

Assistant:

void* ThreadSafeArena::AllocateAlignedWithCleanup(size_t n, size_t align,
                                                  void (*destructor)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, align, destructor);
  } else {
    return AllocateAlignedWithCleanupFallback(n, align, destructor);
  }
}